

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

int QFontDatabase::addApplicationFont(QString *fileName)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  Type *pTVar7;
  QFile *this;
  long in_FS_OFFSET;
  QDeadlineTimer QVar8;
  QArrayData *local_68;
  char *pcStack_60;
  qsizetype local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QByteArray local_38;
  long local_20;
  
  this = (QFile *)&local_68;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char *)0x0;
  local_38.d.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_68,fileName);
  cVar5 = QFileInfo::isNativePath();
  QFileInfo::~QFileInfo((QFileInfo *)&local_68);
  if (cVar5 == '\0') {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_48,fileName);
    cVar5 = QFile::open((QFile *)&local_48,1);
    if (cVar5 == '\0') {
      QFile::~QFile((QFile *)&local_48);
      iVar6 = -1;
      goto LAB_0049e8b0;
    }
    QIODevice::readAll();
    pcVar4 = local_38.d.ptr;
    pDVar3 = local_38.d.d;
    qVar2 = local_58;
    pQVar1 = local_68;
    local_68 = &(local_38.d.d)->super_QArrayData;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcStack_60;
    pcStack_60 = pcVar4;
    local_58 = local_38.d.size;
    local_38.d.size = qVar2;
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,1,0x10);
      }
    }
    this = (QFile *)&local_48;
    QFile::~QFile(this);
  }
  pTVar7 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)this);
  if (pTVar7 != (Type *)0x0) {
    QVar8.t2 = 0xffffffff;
    QVar8.type = 0x7fffffff;
    QVar8.t1 = (qint64)pTVar7;
    QRecursiveMutex::tryLock(QVar8);
  }
  QFontDatabasePrivate::instance();
  iVar6 = QFontDatabasePrivate::addAppFont
                    (&QFontDatabasePrivate::instance::instance,&local_38,fileName);
  if (pTVar7 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
LAB_0049e8b0:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QFontDatabase::addApplicationFont(const QString &fileName)
{
    QByteArray data;
    if (!QFileInfo(fileName).isNativePath()) {
        QFile f(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return -1;

        Q_TRACE(QFontDatabase_addApplicationFont, fileName);

        data = f.readAll();
    }
    QMutexLocker locker(fontDatabaseMutex());
    return QFontDatabasePrivate::instance()->addAppFont(data, fileName);
}